

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Factory.cpp
# Opt level: O2

ElementPtr __thiscall
Rml::Factory::InstanceElement
          (Factory *this,Element *parent,String *instancer_name,String *tag,
          XMLAttributes *attributes)

{
  ElementInstancer *_instancer;
  ElementPtr *element;
  
  _instancer = GetElementInstancer(instancer_name);
  if (_instancer != (ElementInstancer *)0x0) {
    (*_instancer->_vptr_ElementInstancer[2])(this,_instancer,parent,tag,attributes);
    if (*(Element **)this != (Element *)0x0) {
      Element::SetInstancer(*(Element **)this,_instancer);
      Element::SetAttributes(*(Element **)this,attributes);
      PluginRegistry::NotifyElementCreate(*(Element **)this);
      return (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)
             (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)this;
    }
    ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::~unique_ptr
              ((unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> *)this);
  }
  *(undefined8 *)this = 0;
  return (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)
         (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)this;
}

Assistant:

ElementPtr Factory::InstanceElement(Element* parent, const String& instancer_name, const String& tag, const XMLAttributes& attributes)
{
	if (ElementInstancer* instancer = GetElementInstancer(instancer_name))
	{
		if (ElementPtr element = instancer->InstanceElement(parent, tag, attributes))
		{
			element->SetInstancer(instancer);
			element->SetAttributes(attributes);

			PluginRegistry::NotifyElementCreate(element.get());
			return element;
		}
	}

	return nullptr;
}